

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O3

spvc_result
spvc_compiler_get_entry_points
          (spvc_compiler compiler,spvc_entry_point **entry_points,size_t *num_entry_points)

{
  ExecutionModel EVar1;
  spvc_context psVar2;
  size_t sVar3;
  char *pcVar4;
  _Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_> _Var5;
  spvc_result sVar6;
  EntryPoint *name;
  long lVar7;
  SmallVector<spvc_entry_point,_8UL> translated;
  SmallVector<spirv_cross::EntryPoint,_8UL> entries;
  undefined1 *local_260 [2];
  undefined1 local_250 [48];
  undefined1 local_220 [152];
  SmallVector<spirv_cross::EntryPoint,_8UL> local_188;
  
  spirv_cross::Compiler::get_entry_points_and_stages
            (&local_188,
             (compiler->compiler)._M_t.
             super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
             ._M_t.
             super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
             .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl);
  local_220._0_8_ = local_220 + 0x18;
  local_220._8_8_ = 0;
  local_220._16_8_ = 8;
  spirv_cross::SmallVector<spvc_entry_point,_8UL>::reserve
            ((SmallVector<spvc_entry_point,_8UL> *)local_220,
             local_188.super_VectorView<spirv_cross::EntryPoint>.buffer_size);
  if (local_188.super_VectorView<spirv_cross::EntryPoint>.buffer_size != 0) {
    lVar7 = local_188.super_VectorView<spirv_cross::EntryPoint>.buffer_size * 0x28;
    name = local_188.super_VectorView<spirv_cross::EntryPoint>.ptr;
    do {
      EVar1 = name->execution_model;
      pcVar4 = spvc_context_s::allocate_name(compiler->context,&name->name);
      if (pcVar4 == (char *)0x0) {
        psVar2 = compiler->context;
        local_260[0] = local_250;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"Out of memory.","");
        std::__cxx11::string::operator=((string *)psVar2,(string *)local_260);
        if (psVar2->callback != (spvc_error_callback)0x0) {
          (*psVar2->callback)(psVar2->callback_userdata,(psVar2->last_error)._M_dataplus._M_p);
        }
        sVar6 = SPVC_ERROR_OUT_OF_MEMORY;
        if (local_260[0] != local_250) {
          operator_delete(local_260[0]);
        }
        goto LAB_0020cf00;
      }
      spirv_cross::SmallVector<spvc_entry_point,_8UL>::reserve
                ((SmallVector<spvc_entry_point,_8UL> *)local_220,local_220._8_8_ + 1);
      ((spvc_entry_point *)(local_220._0_8_ + local_220._8_8_ * 0x10))->execution_model = EVar1;
      ((spvc_entry_point *)(local_220._0_8_ + local_220._8_8_ * 0x10))->name = pcVar4;
      local_220._8_8_ = local_220._8_8_ + 1;
      name = name + 1;
      lVar7 = lVar7 + -0x28;
    } while (lVar7 != 0);
  }
  _Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl =
       (_Head_base<0UL,_ScratchMemoryAllocation_*,_false>)operator_new(0xa0);
  *(undefined8 *)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x90) = 0;
  *(undefined8 *)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x98) = 0;
  *(undefined8 *)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x80) = 0;
  *(undefined8 *)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x88) = 0;
  *(undefined8 *)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x70) = 0;
  *(undefined8 *)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x78) = 0;
  *(undefined8 *)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x60) = 0;
  *(undefined8 *)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x68) = 0;
  *(undefined8 *)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x50) = 0;
  *(undefined8 *)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x58) = 0;
  *(undefined8 *)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x40) = 0;
  *(undefined8 *)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x48) = 0;
  *(undefined8 *)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined8 *)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x38) = 0;
  *(undefined8 *)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x20) = 0;
  *(undefined8 *)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x28) = 0;
  *(undefined ***)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl =
       &PTR__TemporaryBuffer_004faad0;
  *(undefined8 *)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined8 **)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 8) =
       (undefined8 *)
       ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x20);
  *(undefined8 *)
   ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x18) = 8;
  spirv_cross::SmallVector<spvc_entry_point,_8UL>::operator=
            ((SmallVector<spvc_entry_point,_8UL> *)
             ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 8),
             (SmallVector<spvc_entry_point,_8UL> *)local_220);
  *entry_points =
       *(spvc_entry_point **)
        ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 8);
  *num_entry_points =
       *(size_t *)
        ((long)_Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x10);
  psVar2 = compiler->context;
  spirv_cross::
  SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
  ::reserve(&psVar2->allocations,
            (psVar2->allocations).
            super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
            .buffer_size + 1);
  sVar3 = (psVar2->allocations).
          super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
          .buffer_size;
  (psVar2->allocations).
  super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
  .ptr[sVar3]._M_t.
  super___uniq_ptr_impl<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>._M_t
  .super__Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_>.
  super__Head_base<0UL,_ScratchMemoryAllocation_*,_false> =
       _Var5.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl;
  (psVar2->allocations).
  super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
  .buffer_size = sVar3 + 1;
  sVar6 = SPVC_SUCCESS;
LAB_0020cf00:
  local_220._8_8_ = 0;
  if ((spvc_entry_point *)local_220._0_8_ != (spvc_entry_point *)(local_220 + 0x18)) {
    free((void *)local_220._0_8_);
  }
  spirv_cross::SmallVector<spirv_cross::EntryPoint,_8UL>::~SmallVector(&local_188);
  return sVar6;
}

Assistant:

spvc_result spvc_compiler_get_entry_points(spvc_compiler compiler, const spvc_entry_point **entry_points,
                                           size_t *num_entry_points)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		auto entries = compiler->compiler->get_entry_points_and_stages();
		SmallVector<spvc_entry_point> translated;
		translated.reserve(entries.size());

		for (auto &entry : entries)
		{
			spvc_entry_point new_entry;
			new_entry.execution_model = static_cast<SpvExecutionModel>(entry.execution_model);
			new_entry.name = compiler->context->allocate_name(entry.name);
			if (!new_entry.name)
			{
				compiler->context->report_error("Out of memory.");
				return SPVC_ERROR_OUT_OF_MEMORY;
			}
			translated.push_back(new_entry);
		}

		auto ptr = spvc_allocate<TemporaryBuffer<spvc_entry_point>>();
		ptr->buffer = std::move(translated);
		*entry_points = ptr->buffer.data();
		*num_entry_points = ptr->buffer.size();
		compiler->context->allocations.push_back(std::move(ptr));
	}